

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O1

void leaveblock(FuncState *fs)

{
  int *piVar1;
  byte bVar2;
  char cVar3;
  LexState *ls;
  BlockCnt *pBVar4;
  Vardesc *pVVar5;
  Dyndata *pDVar6;
  BlockCnt *pBVar7;
  Labeldesc *pLVar8;
  TString *name;
  byte bVar9;
  uint uVar10;
  long lVar11;
  int unaff_EBP;
  int iVar12;
  LocVar *pLVar13;
  ulong in_R10;
  long lVar14;
  uint uVar15;
  
  ls = fs->ls;
  pBVar4 = fs->bl;
  bVar2 = pBVar4->nactvar;
  uVar10 = (uint)bVar2;
  do {
    if ((int)uVar10 < 1) {
      unaff_EBP = 0;
      break;
    }
    pVVar5 = (ls->dyd->actvar).arr;
    lVar11 = (long)(int)(fs->firstlocal + uVar10 + -1);
    cVar3 = *(char *)((long)pVVar5 + lVar11 * 0x18 + 9);
    if (cVar3 != '\x03') {
      unaff_EBP = (&pVVar5->vd)[lVar11].ridx + 1;
    }
    uVar10 = uVar10 - 1;
  } while (cVar3 == '\x03');
  bVar9 = fs->nactvar;
  pDVar6 = ls->dyd;
  piVar1 = &(pDVar6->actvar).n;
  *piVar1 = *piVar1 + ((uint)bVar2 - (uint)bVar9);
  if (bVar2 < bVar9) {
    pVVar5 = (pDVar6->actvar).arr;
    iVar12 = (bVar9 - 1 & 0xff) + fs->firstlocal;
    do {
      bVar9 = bVar9 - 1;
      fs->nactvar = bVar9;
      if (*(char *)((long)pVVar5 + (long)iVar12 * 0x18 + 9) == '\x03') {
        pLVar13 = (LocVar *)0x0;
      }
      else {
        pLVar13 = fs->f->locvars + (&pVVar5->vd)[iVar12].pidx;
      }
      if (pLVar13 != (LocVar *)0x0) {
        pLVar13->endpc = fs->pc;
      }
      iVar12 = iVar12 + -1;
    } while (bVar2 < bVar9);
  }
  if (pBVar4->isloop != '\0') {
    name = luaS_newlstr(ls->L,"break",5);
    iVar12 = createlabel(ls,name,0,0);
    if (iVar12 != 0) goto LAB_00149a10;
  }
  if ((pBVar4->previous != (BlockCnt *)0x0) && (pBVar4->upval != '\0')) {
    luaK_codeABCk(fs,OP_CLOSE,unaff_EBP,0,0,0);
  }
LAB_00149a10:
  fs->freereg = (lu_byte)unaff_EBP;
  pDVar6 = ls->dyd;
  (pDVar6->label).n = pBVar4->firstlabel;
  pBVar7 = pBVar4->previous;
  fs->bl = pBVar7;
  if (pBVar7 == (BlockCnt *)0x0) {
    if (pBVar4->firstgoto < (pDVar6->gt).n) {
      undefgoto(ls,(pDVar6->gt).arr + pBVar4->firstgoto);
    }
  }
  else {
    pDVar6 = fs->ls->dyd;
    lVar11 = (long)pBVar4->firstgoto;
    iVar12 = (pDVar6->gt).n;
    if (pBVar4->firstgoto < iVar12) {
      pLVar8 = (pDVar6->gt).arr;
      bVar2 = pBVar4->nactvar;
      do {
        uVar10 = (uint)pLVar8[lVar11].nactvar;
        do {
          if ((int)uVar10 < 1) {
            in_R10 = 0;
            break;
          }
          pVVar5 = (pDVar6->actvar).arr;
          lVar14 = (long)(int)(uVar10 + fs->firstlocal + -1);
          cVar3 = *(char *)((long)pVVar5 + lVar14 * 0x18 + 9);
          if (cVar3 != '\x03') {
            in_R10 = (ulong)((&pVVar5->vd)[lVar14].ridx + 1);
          }
          uVar10 = uVar10 - 1;
        } while (cVar3 == '\x03');
        uVar15 = (uint)bVar2;
        do {
          if ((int)uVar15 < 1) {
            uVar10 = 0;
            break;
          }
          pVVar5 = (pDVar6->actvar).arr;
          lVar14 = (long)(int)(uVar15 + fs->firstlocal + -1);
          cVar3 = *(char *)((long)pVVar5 + lVar14 * 0x18 + 9);
          if (cVar3 != '\x03') {
            uVar10 = (&pVVar5->vd)[lVar14].ridx + 1;
          }
          uVar15 = uVar15 - 1;
        } while (cVar3 == '\x03');
        if ((int)uVar10 < (int)in_R10) {
          in_R10 = CONCAT71((int7)(in_R10 >> 8),pBVar4->upval);
          pLVar8[lVar11].close = pLVar8[lVar11].close | pBVar4->upval;
        }
        pLVar8[lVar11].nactvar = bVar2;
        lVar11 = lVar11 + 1;
      } while (lVar11 != iVar12);
    }
  }
  return;
}

Assistant:

static void leaveblock (FuncState *fs) {
  BlockCnt *bl = fs->bl;
  LexState *ls = fs->ls;
  int hasclose = 0;
  int stklevel = reglevel(fs, bl->nactvar);  /* level outside the block */
  removevars(fs, bl->nactvar);  /* remove block locals */
  lua_assert(bl->nactvar == fs->nactvar);  /* back to level on entry */
  if (bl->isloop)  /* has to fix pending breaks? */
    hasclose = createlabel(ls, luaS_newliteral(ls->L, "break"), 0, 0);
  if (!hasclose && bl->previous && bl->upval)  /* still need a 'close'? */
    luaK_codeABC(fs, OP_CLOSE, stklevel, 0, 0);
  fs->freereg = stklevel;  /* free registers */
  ls->dyd->label.n = bl->firstlabel;  /* remove local labels */
  fs->bl = bl->previous;  /* current block now is previous one */
  if (bl->previous)  /* was it a nested block? */
    movegotosout(fs, bl);  /* update pending gotos to enclosing block */
  else {
    if (bl->firstgoto < ls->dyd->gt.n)  /* still pending gotos? */
      undefgoto(ls, &ls->dyd->gt.arr[bl->firstgoto]);  /* error */
  }
}